

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

bool __thiscall
crnd::static_huffman_data_model::prepare_decoder_tables(static_huffman_data_model *this)

{
  bool bVar1;
  int iVar2;
  decoder_tables *pdVar3;
  EVP_PKEY_CTX *pEVar4;
  EVP_PKEY_CTX *ctx;
  uint uVar5;
  decoder_tables *pdVar6;
  
  this->m_total_syms = (this->m_code_sizes).m_size;
  if (this->m_pDecode_tables == (decoder_tables *)0x0) {
    pdVar3 = (decoder_tables *)crnd_malloc(0xc0,(size_t *)0x0);
    pdVar6 = (decoder_tables *)0x0;
    if (pdVar3 != (decoder_tables *)0x0) {
      pdVar3->m_sorted_symbol_order = (uint16 *)0x0;
      *(undefined8 *)&pdVar3->m_cur_lookup_size = 0;
      *(undefined8 *)((long)&pdVar3->m_lookup + 4) = 0;
      pdVar6 = pdVar3;
    }
    this->m_pDecode_tables = pdVar6;
  }
  uVar5 = this->m_total_syms;
  ctx = (EVP_PKEY_CTX *)(ulong)uVar5;
  pEVar4 = ctx;
  if (0x10 < uVar5) {
    do {
      pEVar4 = (EVP_PKEY_CTX *)((ulong)pEVar4 >> 1);
      bVar1 = 3 < uVar5;
      uVar5 = (uint)pEVar4;
    } while (bVar1);
  }
  iVar2 = prefix_coding::decoder_tables::init(this->m_pDecode_tables,ctx);
  return SUB41(iVar2,0);
}

Assistant:

bool static_huffman_data_model::prepare_decoder_tables()
    {
        uint32 total_syms = m_code_sizes.size();

        CRND_ASSERT((total_syms >= 1) && (total_syms <= prefix_coding::cMaxSupportedSyms));

        m_total_syms = total_syms;

        if (!m_pDecode_tables)
            m_pDecode_tables = crnd_new<prefix_coding::decoder_tables>();

        return m_pDecode_tables->init(m_total_syms, &m_code_sizes[0], compute_decoder_table_bits());
    }